

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O2

_Bool hpa_should_purge(tsdn_t *tsdn,hpa_shard_t *shard)

{
  long lVar1;
  long lVar2;
  _Bool _Var3;
  size_t sVar4;
  
  lVar1 = *(long *)&(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins
                    [0x14].low_bits_low_water;
  lVar2 = *(long *)(tsdn[2].tsd.cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.
                    bin_flush_delay_items + 8);
  sVar4 = hpa_ndirty_max(tsdn,shard);
  if (sVar4 < (ulong)(lVar1 - lVar2)) {
    return true;
  }
  _Var3 = hpa_hugify_blocked_by_ndirty(tsdn,shard);
  return _Var3;
}

Assistant:

static bool
hpa_should_purge(tsdn_t *tsdn, hpa_shard_t *shard) {
	malloc_mutex_assert_owner(tsdn, &shard->mtx);
	if (hpa_adjusted_ndirty(tsdn, shard) > hpa_ndirty_max(tsdn, shard)) {
		return true;
	}
	if (hpa_hugify_blocked_by_ndirty(tsdn, shard)) {
		return true;
	}
	return false;
}